

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

BinsSelectExpr *
slang::ast::SetExprBinsSelectExpr::fromSyntax
          (SimpleBinsSelectExprSyntax *syntax,ASTContext *context)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  SourceRange sourceRange;
  basic_string_view<char,_std::char_traits<char>_> __x;
  SourceRange assignmentRange;
  bool bVar1;
  Scope *pSVar2;
  CoverCrossBodySymbol *lhs;
  Compilation *context_00;
  CoverCrossSymbol *pCVar3;
  ExpressionSyntax *pEVar4;
  SyntaxNode *pSVar5;
  BinsSelectExpr *pBVar6;
  Expression *args;
  SetExprBinsSelectExpr *pSVar7;
  SourceLocation in_RSI;
  SourceLocation in_RDI;
  Expression *expr;
  Expression *matches;
  CoverCrossSymbol *cross;
  Compilation *comp;
  Scope *parent;
  CoverCrossBodySymbol *body;
  Expression *in_stack_ffffffffffffff30;
  Type *this;
  Token *in_stack_ffffffffffffff40;
  SourceLocation this_00;
  ASTContext *in_stack_ffffffffffffff48;
  SourceLocation in_stack_ffffffffffffff50;
  ASTContext *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  DiagCode in_stack_ffffffffffffff64;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff80;
  Type *local_70;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  ExpressionSyntax *in_stack_ffffffffffffffa8;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffffb0;
  bitmask<slang::ast::ASTFlags> extraFlags;
  SourceLocation in_stack_fffffffffffffff8;
  
  pSVar2 = not_null<const_slang::ast::Scope_*>::operator->
                     ((not_null<const_slang::ast::Scope_*> *)0x43ddf4);
  Scope::asSymbol(pSVar2);
  lhs = Symbol::as<slang::ast::CoverCrossBodySymbol>((Symbol *)0x43de04);
  pSVar2 = Symbol::getParentScope(&lhs->super_Symbol);
  context_00 = ASTContext::getCompilation((ASTContext *)0x43de32);
  Scope::asSymbol(pSVar2);
  pCVar3 = Symbol::as<slang::ast::CoverCrossSymbol>((Symbol *)0x43de4f);
  pEVar4 = not_null<slang::syntax::ExpressionSyntax_*>::operator->
                     ((not_null<slang::syntax::ExpressionSyntax_*> *)0x43de68);
  if ((pEVar4->super_SyntaxNode).kind == IdentifierName) {
    pSVar5 = &not_null<slang::syntax::ExpressionSyntax_*>::operator->
                        ((not_null<slang::syntax::ExpressionSyntax_*> *)0x43de85)->super_SyntaxNode;
    slang::syntax::SyntaxNode::as<slang::syntax::IdentifierNameSyntax>(pSVar5);
    parsing::Token::valueText(in_stack_ffffffffffffff40);
    in_stack_ffffffffffffffa8 = (ExpressionSyntax *)(pCVar3->super_Symbol).name._M_len;
    in_stack_ffffffffffffffb0.m_bits = (underlying_type)(pCVar3->super_Symbol).name._M_str;
    __x._M_str._0_4_ = in_stack_ffffffffffffff60;
    __x._M_len = (size_t)in_stack_ffffffffffffff58;
    __x._M_str._4_4_ = in_stack_ffffffffffffff64;
    __y._M_str = (char *)in_stack_ffffffffffffff50;
    __y._M_len = (size_t)in_stack_ffffffffffffff48;
    bVar1 = std::operator==(__x,__y);
    if (bVar1) {
      if (*(long *)((long)in_RDI + 0x20) != 0) {
        slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_ffffffffffffff80.m_bits);
        sourceRange.endLoc = in_RSI;
        sourceRange.startLoc = in_stack_ffffffffffffff50;
        ASTContext::addDiag(in_stack_ffffffffffffff48,in_stack_ffffffffffffff64,sourceRange);
      }
      pBVar6 = &BumpAllocator::emplace<slang::ast::CrossIdBinsSelectExpr>
                          ((BumpAllocator *)in_stack_ffffffffffffff30)->super_BinsSelectExpr;
      return pBVar6;
    }
  }
  this_00 = in_RSI;
  if (*(long *)((long)in_RDI + 0x20) != 0) {
    pSVar5 = &not_null<slang::syntax::PatternSyntax_*>::operator->
                        ((not_null<slang::syntax::PatternSyntax_*> *)0x43df98)->super_SyntaxNode;
    slang::syntax::SyntaxNode::as<slang::syntax::ExpressionPatternSyntax>(pSVar5);
    not_null<slang::syntax::ExpressionSyntax_*>::operator*
              ((not_null<slang::syntax::ExpressionSyntax_*> *)0x43dfac);
    this_00 = in_RSI;
    bitmask<slang::ast::ASTFlags>::bitmask
              ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffff80,AllowUnboundedLiteral);
    bindCovergroupExpr(in_stack_ffffffffffffffa8,
                       (ASTContext *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       local_70,in_stack_ffffffffffffffb0);
    bVar1 = Expression::bad(in_stack_ffffffffffffff30);
    if (!bVar1) {
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x43e006)
      ;
      bVar1 = Type::isUnbounded((Type *)0x43e00e);
      if (!bVar1) {
        ASTContext::requireIntegral(in_stack_ffffffffffffff58,(Expression *)in_RSI);
      }
    }
  }
  this = lhs->crossQueueType;
  args = (Expression *)
         not_null<slang::syntax::ExpressionSyntax_*>::operator*
                   ((not_null<slang::syntax::ExpressionSyntax_*> *)0x43e048);
  SourceRange::SourceRange((SourceRange *)this);
  extraFlags.m_bits = (underlying_type)this_00;
  bitmask<slang::ast::ASTFlags>::bitmask
            ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffff60,None);
  assignmentRange.endLoc = in_stack_fffffffffffffff8;
  assignmentRange.startLoc = in_RDI;
  Expression::bindRValue
            ((Type *)lhs,(ExpressionSyntax *)pSVar2,assignmentRange,(ASTContext *)context_00,
             extraFlags);
  pSVar7 = BumpAllocator::
           emplace<slang::ast::SetExprBinsSelectExpr,slang::ast::Expression_const&,slang::ast::Expression_const*&>
                     ((BumpAllocator *)this_00,args,(Expression **)this);
  return &pSVar7->super_BinsSelectExpr;
}

Assistant:

BinsSelectExpr& SetExprBinsSelectExpr::fromSyntax(const SimpleBinsSelectExprSyntax& syntax,
                                                  const ASTContext& context) {
    auto& body = context.scope->asSymbol().as<CoverCrossBodySymbol>();
    SLANG_ASSERT(body.crossQueueType);

    auto parent = body.getParentScope();
    SLANG_ASSERT(parent);

    // If the syntax is a simple identifier that names our parent cross,
    // we're selecting the whole cross (which is otherwise not an expression).
    auto& comp = context.getCompilation();
    auto& cross = parent->asSymbol().as<CoverCrossSymbol>();
    if (syntax.expr->kind == SyntaxKind::IdentifierName &&
        syntax.expr->as<IdentifierNameSyntax>().identifier.valueText() == cross.name) {

        if (syntax.matchesClause)
            context.addDiag(diag::InvalidBinsMatches, syntax.matchesClause->sourceRange());

        return *comp.emplace<CrossIdBinsSelectExpr>();
    }

    const Expression* matches = nullptr;
    if (syntax.matchesClause) {
        matches =
            &bindCovergroupExpr(*syntax.matchesClause->pattern->as<ExpressionPatternSyntax>().expr,
                                context, nullptr, ASTFlags::AllowUnboundedLiteral);
        if (!matches->bad() && !matches->type->isUnbounded())
            context.requireIntegral(*matches);
    }

    auto& expr = Expression::bindRValue(*body.crossQueueType, *syntax.expr, {}, context);
    return *comp.emplace<SetExprBinsSelectExpr>(expr, matches);
}